

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * CreateReturn(ExpressionContext *ctx,SynBase *source,ExprBase *result)

{
  ScopeData *pSVar1;
  bool bVar2;
  int iVar3;
  ScopeData *curr_1;
  TypeFunction *pTVar4;
  SynBase *value;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  SynBase *pSVar6;
  FunctionData *pFVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _func_int **pp_Var8;
  TypeError *pTVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TypeBase *pTVar10;
  ScopeData *curr;
  TypeBase *pTVar11;
  ExprBase *unaff_R13;
  undefined4 extraout_var_02;
  
  if ((result->type != (TypeBase *)0x0) && (result->type->typeID == 0)) {
    for (pSVar1 = ctx->scope; (pSVar1 != (ScopeData *)0x0 && (pSVar1->ownerType == (TypeBase *)0x0))
        ; pSVar1 = pSVar1->scope) {
      pFVar7 = pSVar1->ownerFunction;
      if (pFVar7 != (FunctionData *)0x0) goto LAB_001565a0;
    }
    pFVar7 = (FunctionData *)0x0;
LAB_001565a0:
    if (pFVar7 != (FunctionData *)0x0) {
      pFVar7->hasExplicitReturn = true;
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
    pTVar11 = result->type;
    goto LAB_001567d2;
  }
  for (pSVar1 = ctx->scope; (pSVar1 != (ScopeData *)0x0 && (pSVar1->ownerType == (TypeBase *)0x0));
      pSVar1 = pSVar1->scope) {
    pFVar7 = pSVar1->ownerFunction;
    if (pFVar7 != (FunctionData *)0x0) goto LAB_0015640d;
  }
  pFVar7 = (FunctionData *)0x0;
LAB_0015640d:
  value = (SynBase *)result;
  if (pFVar7 != (FunctionData *)0x0) {
    pTVar11 = pFVar7->type->returnType;
    if (pTVar11 == ctx->typeAuto) {
      bVar2 = AssertValueExpression(ctx,source,result);
      if (!bVar2) {
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        unaff_R13 = (ExprBase *)CONCAT44(extraout_var_01,iVar3);
        pTVar11 = ctx->typeVoid;
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        pp_Var8 = (_func_int **)CONCAT44(extraout_var_02,iVar3);
        pSVar6 = result->source;
        pTVar9 = ExpressionContext::GetErrorType(ctx);
        *(undefined4 *)(pp_Var8 + 1) = 0;
        pp_Var8[2] = (_func_int *)pSVar6;
        pp_Var8[3] = (_func_int *)pTVar9;
        pp_Var8[4] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var8 + 5) = 0;
        *pp_Var8 = (_func_int *)&PTR__ExprError_00229b38;
        pp_Var8[0xc] = (_func_int *)0x0;
        pp_Var8[6] = (_func_int *)(pp_Var8 + 8);
        pp_Var8[8] = (_func_int *)result;
        pp_Var8[7] = (_func_int *)0x400000002;
        pp_Var8[9] = (_func_int *)0x0;
        unaff_R13->typeID = 0x1c;
        unaff_R13->source = source;
        unaff_R13->type = pTVar11;
        unaff_R13->next = (ExprBase *)0x0;
        unaff_R13->listed = false;
        unaff_R13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229b70;
        unaff_R13[1]._vptr_ExprBase = pp_Var8;
        *(undefined8 *)&unaff_R13[1].typeID = 0;
        unaff_R13[1].source = (SynBase *)0x0;
        goto LAB_0015668d;
      }
      pTVar11 = result->type;
      pTVar4 = ExpressionContext::GetFunctionType(ctx,source,pTVar11,pFVar7->type->arguments);
      pFVar7->type = pTVar4;
    }
    if ((pTVar11 == ctx->typeVoid) && (result->type != ctx->typeVoid)) {
      anon_unknown.dwarf_9fd58::Report(ctx,source,"ERROR: \'void\' function returning a value");
    }
    if ((pTVar11 != ctx->typeVoid) && (result->type == ctx->typeVoid)) {
      anon_unknown.dwarf_9fd58::Report
                (ctx,source,"ERROR: function must return a value of type \'%.*s\'",
                 (ulong)(uint)(*(int *)&(pTVar11->name).end - (int)(pTVar11->name).begin));
    }
    value = (SynBase *)CreateCast(ctx,source,result,pFVar7->type->returnType,false);
    pFVar7->hasExplicitReturn = true;
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    unaff_R13 = (ExprBase *)CONCAT44(extraout_var,iVar3);
    pTVar11 = ctx->typeVoid;
    pEVar5 = CreateFunctionCoroutineStateUpdate(ctx,source,pFVar7,0);
    pSVar6 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    pSVar6 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar6,pFVar7,ctx->scope);
    unaff_R13->typeID = 0x1c;
    unaff_R13->source = source;
    unaff_R13->type = pTVar11;
    unaff_R13->next = (ExprBase *)0x0;
    unaff_R13->listed = false;
    unaff_R13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229b70;
    unaff_R13[1]._vptr_ExprBase = (_func_int **)value;
    *(ExprBase **)&unaff_R13[1].typeID = pEVar5;
    unaff_R13[1].source = pSVar6;
  }
LAB_0015668d:
  if (pFVar7 != (FunctionData *)0x0) {
    return unaff_R13;
  }
  pTVar11 = (TypeBase *)value->end;
  if ((pTVar11 != (TypeBase *)0x0) && (pTVar11->typeID == 0x15)) {
    value = (SynBase *)CreateCast(ctx,source,(ExprBase *)value,pTVar11,false);
  }
  bVar2 = AssertValueExpression(ctx,(SynBase *)value->begin,(ExprBase *)value);
  if (bVar2) {
    pTVar11 = (TypeBase *)value->end;
    bVar2 = ExpressionContext::IsNumericType(ctx,pTVar11);
    if ((!bVar2) && ((pTVar11 == (TypeBase *)0x0 || (pTVar11->typeID != 0x19)))) {
      anon_unknown.dwarf_9fd58::Report
                (ctx,source,"ERROR: global return cannot accept \'%.*s\'",
                 (ulong)(uint)(*(int *)&(pTVar11->name).end - (int)(pTVar11->name).begin));
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_03,iVar3);
    pTVar11 = ctx->typeVoid;
    result = (ExprBase *)value;
  }
  else {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_04,iVar3);
    pTVar11 = ctx->typeVoid;
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    result = (ExprBase *)CONCAT44(extraout_var_05,iVar3);
    pSVar6 = (SynBase *)value->begin;
    pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ((SynBase *)result)->typeID = 0;
    ((SynBase *)result)->begin = (Lexeme *)pSVar6;
    ((SynBase *)result)->end = (Lexeme *)pTVar10;
    (((SynBase *)result)->pos).begin = (char *)0x0;
    *(bool *)&(((SynBase *)result)->pos).end = false;
    ((SynBase *)result)->_vptr_SynBase = (_func_int **)&PTR__ExprError_00229b38;
    (((SynBase *)((long)result + 0x40))->pos).begin = (char *)0x0;
    ((SynBase *)result)->next = (SynBase *)((long)result + 0x40);
    ((SynBase *)((long)result + 0x40))->_vptr_SynBase = (_func_int **)value;
    ((SynBase *)result)->listed = true;
    ((SynBase *)result)->isInternal = false;
    *(undefined6 *)&((SynBase *)result)->field_0x3a = 0x40000;
    *(TypeBase **)&((SynBase *)((long)result + 0x40))->typeID = (TypeBase *)0x0;
  }
LAB_001567d2:
  pEVar5->typeID = 0x1c;
  pEVar5->source = source;
  pEVar5->type = pTVar11;
  pEVar5->next = (ExprBase *)0x0;
  pEVar5->listed = false;
  pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229b70;
  pEVar5[1]._vptr_ExprBase = (_func_int **)result;
  *(undefined8 *)&pEVar5[1].typeID = 0;
  pEVar5[1].source = (SynBase *)0x0;
  return pEVar5;
}

Assistant:

ExprBase* CreateReturn(ExpressionContext &ctx, SynBase *source, ExprBase *result)
{
	if(isType<TypeError>(result->type))
	{
		if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
			function->hasExplicitReturn = true;

		return new (ctx.get<ExprReturn>()) ExprReturn(source, result->type, result, NULL, NULL);
	}

	if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
	{
		TypeBase *returnType = function->type->returnType;

		// If return type is auto, set it to type that is being returned
		if(returnType == ctx.typeAuto)
		{
			if(!AssertValueExpression(ctx, source, result))
				return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

			returnType = result->type;

			function->type = ctx.GetFunctionType(source, returnType, function->type->arguments);
		}

		if(returnType == ctx.typeVoid && result->type != ctx.typeVoid)
			Report(ctx, source, "ERROR: 'void' function returning a value");
		if(returnType != ctx.typeVoid && result->type == ctx.typeVoid)
			Report(ctx, source, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		result = CreateCast(ctx, source, result, function->type->returnType, false);

		function->hasExplicitReturn = true;

		// TODO: checked return value

		return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, result, CreateFunctionCoroutineStateUpdate(ctx, source, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope));
	}

	if(isType<TypeFunction>(result->type))
		result = CreateCast(ctx, source, result, result->type, false);

	if(!AssertValueExpression(ctx, result->source, result))
		return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

	if(!ctx.IsNumericType(result->type) && !isType<TypeEnum>(result->type))
		Report(ctx, source, "ERROR: global return cannot accept '%.*s'", FMT_ISTR(result->type->name));

	return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, result, NULL, NULL);
}